

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

int opentin(void)

{
  byte bVar1;
  obj *poVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  obj *obj;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  
  if (((tin.tin)->where != '\x03') && (bVar3 = obj_here(tin.tin,(int)u.ux,(int)u.uy), bVar3 == '\0')
     ) {
    return 0;
  }
  iVar5 = tin.usedtime + 1;
  if (0x31 < tin.usedtime) {
    tin.usedtime = iVar5;
    pline("You give up your attempt to open the tin.");
    return 0;
  }
  if (iVar5 < tin.reqtime) {
    tin.usedtime = iVar5;
    return 1;
  }
  tin.usedtime = iVar5;
  if (((short)*(uint *)&(tin.tin)->field_0x4a < 0) ||
     ((((*(uint *)&(tin.tin)->field_0x4a & 1) != 0 && ((tin.tin)->spe != -1)) &&
      (uVar6 = mt_random(), (uVar6 & 7) == 0)))) {
    b_trapped("tin",0);
    pcVar11 = "destroyed";
  }
  else {
    pline("You succeed in opening the tin.");
    if ((tin.tin)->spe == '\x01') {
      if (((tin.tin)->field_0x4a & 1) == 0) {
        pline("It contains spinach.");
      }
      else {
        if ((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
          pcVar11 = " ";
        }
        else if (ublindf == (obj *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = "";
          if (ublindf->oartifact == '\x1d') {
            pcVar11 = " ";
          }
        }
        if ((((u.uprops[0x1e].intrinsic == 0) &&
             ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((pcVar8 = "", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar8 = hcolor("green");
        }
        pline("It contains some decaying%s%s substance.",pcVar11,pcVar8);
      }
      cVar4 = yn_function("Eat it?","yn",'n');
      if (cVar4 != 'n') {
        *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
        costly_tin((char *)0x0);
        if (((tin.tin)->field_0x4a & 1) == 0) {
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             (u.umonnum != u.umonster)) {
            dmgtype(youmonst.data,0x24);
          }
          pline("This makes you feel like %s!");
        }
        lesshungry(600);
        gainstr(tin.tin,0,'\0');
        violated(5);
        goto LAB_0019347f;
      }
      if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
          ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) &&
         ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0)) {
        *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
      }
LAB_0019345d:
      if (flags.verbose != '\0') {
        pline("You discard the open tin.");
      }
    }
    else {
      if ((tin.tin)->corpsenm != -1) {
        uVar6 = 4;
        if (((tin.tin)->field_0x4a & 1) == 0) {
          if ((tin.tin)->spe == -1) {
            uVar6 = 5;
          }
          else {
            uVar6 = mt_random();
            uVar6 = uVar6 % 0xf;
          }
        }
        iVar5 = (tin.tin)->corpsenm;
        if ((iVar5 == 0x153) && (((tin.tin)->field_0x4a & 1) == 0)) {
          uVar6 = 0xf;
        }
        if ((((uVar6 != 4) || ((uVar10 = 5, iVar5 != 0xa3 && (iVar5 != 0x154)))) &&
            (uVar10 = uVar6, (tin.tin)->spe == -1)) &&
           ((((tin.tin)->field_0x4a & 2) == 0 &&
            (uVar6 = mt_random(), uVar6 * -0x49249249 < 0x24924925)))) {
          uVar10 = 4;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
          pcVar11 = mons_mname(mons + (tin.tin)->corpsenm);
          cVar4 = '\0';
          if ((mons[(tin.tin)->corpsenm].geno & 0x1000) != 0) {
            cVar4 = ((mons[(tin.tin)->corpsenm].mflags2 & 0x80000) == 0) + '\x01';
          }
        }
        else {
          cVar4 = '\0';
          pcVar11 = rndmonnam();
        }
        if (cVar4 == '\0') {
          pcVar11 = makeplural(pcVar11);
        }
        pcVar8 = "";
        if (cVar4 == '\x02') {
          pcVar8 = "the ";
        }
        pline("It smells like %s%s.",pcVar8,pcVar11);
        cVar4 = yn_function("Eat it?","yn",'n');
        if (cVar4 != 'n') {
          victual.piece = (obj *)0x0;
          victual._20_1_ = victual._20_1_ & 0xf1;
          pcVar11 = tintxts[(int)uVar10].txt;
          pcVar8 = mons_mname(mons + (tin.tin)->corpsenm);
          pline("You consume %s %s.",pcVar11,pcVar8);
          if ((uVar10 == 10) && (uVar6 = mt_random(), (uVar6 & 1) != 0)) {
            obj = mksobj(level,0x122,'\0','\0');
            poVar2 = tin.tin;
            uVar7 = *(uint *)&(tin.tin)->field_0x4a & 2;
            uVar6 = *(uint *)&obj->field_0x4a;
            *(uint *)&obj->field_0x4a = uVar6 & 0xfffffffd | uVar7;
            *(uint *)&obj->field_0x4a =
                 uVar6 & 0xfffffffc | uVar7 | *(uint *)&poVar2->field_0x4a & 1;
            pline("There is a free fortune cookie inside!");
            hold_another_object(obj,"It falls to the floor.",(char *)0x0,(char *)0x0);
          }
          uVar6 = (tin.tin)->corpsenm;
          bVar1 = mons[(int)uVar6].mlet;
          uVar9 = (ulong)bVar1;
          iVar5 = 7;
          if (bVar1 < 0x1f) {
            if (bVar1 < 0x16) {
              if ((bVar1 == 2) || (bVar1 == 10)) {
LAB_001936f9:
                iVar5 = 5;
              }
            }
            else if ((bVar1 == 0x16) || (bVar1 == 0x19)) goto LAB_001936f9;
          }
          else {
            if (0x29 < bVar1) {
LAB_001935b0:
              if (bVar1 == 0x2a) {
                if (uVar6 != 0xd6) goto LAB_001936b0;
              }
              else {
                if (bVar1 == 0x36) goto LAB_001936ed;
                if ((bVar1 == 0x37) && ((uVar6 | 2) != 0x106)) goto LAB_001936b0;
              }
              goto LAB_001936fe;
            }
            if (bVar1 != 0x1f) {
              if (bVar1 == 0x20) goto LAB_001936f9;
              goto LAB_001936fe;
            }
            if (uVar6 == 0x9e) goto LAB_001935b0;
LAB_001936b0:
            if (bVar1 < 0x38) {
              if ((0x102400404U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001936f9;
              if (uVar9 == 0x1f) {
                if (uVar6 != 0x9e) goto LAB_001936f9;
                if (bVar1 == 0x37) goto LAB_001936d3;
              }
              else if (uVar9 == 0x37) {
LAB_001936d3:
                if ((uVar6 | 2) != 0x106) goto LAB_001936f9;
              }
            }
LAB_001936ed:
            iVar5 = 6;
            if (mons[(int)uVar6].mlet == '6') goto LAB_001936f9;
          }
LAB_001936fe:
          violated(iVar5);
          poVar2 = tin.tin;
          *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
          cprefx(poVar2->corpsenm);
          cpostfx((tin.tin)->corpsenm);
          costly_tin((char *)0x0);
          if (tintxts[(int)uVar10].nut < 0) {
            uVar6 = mt_random();
            make_vomiting((ulong)(uVar6 % 0xf + 10),'\0');
          }
          else {
            lesshungry(tintxts[(int)uVar10].nut);
          }
          if ((uVar10 == 0xb) || (uVar10 == 0)) {
            uVar6 = mt_random();
            incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)(uVar6 % 0xf + 1));
            pcVar11 = body_part(3);
            pcVar11 = makeplural(pcVar11);
            pline("Eating deep fried food made your %s very slippery.",pcVar11);
          }
          goto LAB_0019347f;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
          *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
        }
        goto LAB_0019345d;
      }
      pline("It turns out to be empty.");
      *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
    }
    pcVar11 = (char *)0x0;
  }
  costly_tin(pcVar11);
LAB_0019347f:
  if ((tin.tin)->where == '\x03') {
    useup(tin.tin);
  }
  else {
    useupf(tin.tin,1);
  }
  tin.tin = (obj *)0x0;
  return 0;
}

Assistant:

static int opentin(void) /* called during each move whilst opening a tin */
{
	int r;
	const char *what;
	int which;

	if (!carried(tin.tin) && !obj_here(tin.tin, u.ux, u.uy))
					/* perhaps it was stolen? */
		return 0;		/* %% probably we should use tinoid */
	if (tin.usedtime++ >= 50) {
		pline("You give up your attempt to open the tin.");
		return 0;
	}
	if (tin.usedtime < tin.reqtime)
		return 1;		/* still busy */
	if (tin.tin->otrapped ||
	   (tin.tin->cursed && tin.tin->spe != -1 && !rn2(8))) {
		b_trapped("tin", 0);
		costly_tin("destroyed");
		goto use_me;
	}
	pline("You succeed in opening the tin.");
	if (tin.tin->spe != 1) {
	    if (tin.tin->corpsenm == NON_PM) {
		pline("It turns out to be empty.");
		tin.tin->dknown = tin.tin->known = TRUE;
		costly_tin(NULL);
		goto use_me;
	    }
	    if (tin.tin->cursed) {
		r = ROTTEN_TIN;			/* always rotten if cursed */
	    } else if (tin.tin->spe == -1) {
		r = HOMEMADE_TIN;		/* player made it */
	    } else {
		r = rn2(TTSZ - 2);		/* else take your pick */
	    }
	    if (tin.tin->corpsenm == PM_GIANT_TURTLE && !tin.tin->cursed) {
		/* Giant turtles are always endangeredelicious! */
		r = DELICIOUS_SOUP_TIN;
	    }
	    if (r == ROTTEN_TIN && (tin.tin->corpsenm == PM_LIZARD ||
			tin.tin->corpsenm == PM_LICHEN))
		r = HOMEMADE_TIN;		/* lizards don't rot */
	    else if (tin.tin->spe == -1 && !tin.tin->blessed && !rn2(7))
		r = ROTTEN_TIN;			/* some homemade tins go bad */
	    which = 0;	/* 0=>plural, 1=>as-is, 2=>"the" prefix */
	    if (Hallucination) {
		what = rndmonnam();
	    } else {
		what = mons_mname(&mons[tin.tin->corpsenm]);
		if (mons[tin.tin->corpsenm].geno & G_UNIQ)
		    which = type_is_pname(&mons[tin.tin->corpsenm]) ? 1 : 2;
	    }
	    if (which == 0) what = makeplural(what);
	    pline("It smells like %s%s.", (which == 2) ? "the " : "", what);
	    if (yn("Eat it?") == 'n') {
		if (!Hallucination) tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose) pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }
	    /* in case stop_occupation() was called on previous meal */
	    victual.piece = NULL;
	    victual.fullwarn = victual.eating = victual.doreset = FALSE;

	    pline("You consume %s %s.", tintxts[r].txt,
			mons_mname(&mons[tin.tin->corpsenm]));

	    /* SZECHUAN_TIN might have free fortune cookie */
	    if (r == SZECHUAN_TIN && rn2(2)) {
		struct obj *cookie = mksobj(level, FORTUNE_COOKIE, FALSE, FALSE);
		cookie->blessed = tin.tin->blessed;
		cookie->cursed = tin.tin->cursed;
#ifdef INVISIBLE_OBJECTS
		cookie->oinvis = tin.tin->oinvis;
#endif
		pline("There is a free fortune cookie inside!");
		hold_another_object(cookie, "It falls to the floor.", NULL, NULL);
	    }

	    /* KMH, conduct */
	    /* Eating a tin of monster meat breaks food-conducts here. */
	    if (!vegetarian(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGETARIAN);
	    else if (!vegan(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    tin.tin->dknown = tin.tin->known = TRUE;
	    cprefx(tin.tin->corpsenm); cpostfx(tin.tin->corpsenm);

	    /* charge for one at pre-eating cost */
	    costly_tin(NULL);

	    /* check for vomiting added by GAN 01/16/87 */
	    if (tintxts[r].nut < 0) make_vomiting((long)rn1(15,10), FALSE);
	    else lesshungry(tintxts[r].nut);

	    if (r == 0 || r == FRENCH_FRIED_TIN) {
	        /* Assume !Glib, because you can't open tins when Glib. */
		incr_itimeout(&Glib, rnd(15));
		pline("Eating deep fried food made your %s very slippery.",
		      makeplural(body_part(FINGER)));
	    }
	} else {
	    if (tin.tin->cursed)
		pline("It contains some decaying%s%s substance.",
			Blind ? "" : " ", Blind ? "" : hcolor("green"));
	    else
		pline("It contains spinach.");

	    if (yn("Eat it?") == 'n') {
		if (!Hallucination && !tin.tin->cursed)
		    tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose)
		    pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }

	    tin.tin->dknown = tin.tin->known = TRUE;
	    costly_tin(NULL);

	    if (!tin.tin->cursed)
		pline("This makes you feel like %s!",
		      Hallucination ? "Swee'pea" : "Popeye");
	    lesshungry(600);
	    gainstr(tin.tin, 0, FALSE);
	    /* Eating a tin of spinach breaks foodless-conduct here. */
	    violated(CONDUCT_FOODLESS);
	}
use_me:
	if (carried(tin.tin)) useup(tin.tin);
	else useupf(tin.tin, 1L);
	tin.tin = NULL;
	return 0;
}